

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_i2rescale(fitsfile *infptr,int naxis,long *naxes,double rescale,fitsfile *outfptr,int *status
                )

{
  size_t sVar1;
  int *status_00;
  fitsfile *fptr;
  int iVar2;
  short *array;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  long firstelem;
  long lVar6;
  double dVar7;
  short nullvalue;
  int *local_70;
  int local_64;
  double local_60;
  fitsfile *local_58;
  fitsfile *local_50;
  size_t local_48;
  long local_40;
  int tstatus;
  int anynul;
  
  sVar1 = *naxes;
  lVar4 = 1;
  lVar6 = lVar4;
  for (; lVar4 < naxis; lVar4 = lVar4 + 1) {
    lVar6 = lVar6 * naxes[lVar4];
  }
  local_70 = status;
  local_60 = rescale;
  local_58 = infptr;
  local_50 = outfptr;
  array = (short *)calloc(sVar1,2);
  fptr = local_58;
  if (array == (short *)0x0) {
    *local_70 = 0x71;
    iVar2 = 0x71;
  }
  else {
    tstatus = 0;
    lVar4 = 0;
    ffgky(local_58,0x15,"BLANK",&nullvalue,(char *)0x0,&tstatus);
    status_00 = local_70;
    local_64 = tstatus;
    ffpscl(fptr,1.0,0.0,local_70);
    ffpscl(local_50,1.0,0.0,status_00);
    sVar5 = 0;
    if (0 < (long)sVar1) {
      sVar5 = sVar1;
    }
    if (lVar6 < 1) {
      lVar6 = lVar4;
    }
    firstelem = 1;
    local_48 = sVar1;
    while (lVar4 != lVar6) {
      ffgpvi(local_58,1,firstelem,local_48,0,array,&anynul,local_70);
      sVar1 = local_48;
      if (local_64 == 0) {
        for (sVar3 = 0; sVar5 != sVar3; sVar3 = sVar3 + 1) {
          if (array[sVar3] != nullvalue) {
            dVar7 = (double)(int)array[sVar3] / local_60;
            array[sVar3] = (short)(int)(dVar7 + *(double *)
                                                 (&DAT_001be040 + (ulong)(dVar7 < 0.0) * 8));
          }
        }
      }
      else {
        for (sVar3 = 0; sVar5 != sVar3; sVar3 = sVar3 + 1) {
          array[sVar3] = (short)(int)((double)(int)array[sVar3] / local_60 +
                                     *(double *)
                                      (&DAT_001be040 +
                                      (ulong)((double)(int)array[sVar3] / local_60 < 0.0) * 8));
        }
      }
      local_40 = lVar4;
      ffppri(local_50,1,firstelem,local_48,array,local_70);
      firstelem = firstelem + sVar1;
      lVar4 = local_40 + 1;
    }
    free(array);
    iVar2 = *local_70;
  }
  return iVar2;
}

Assistant:

int fp_i2rescale(fitsfile *infptr, int naxis, long *naxes, double rescale,
    fitsfile *outfptr, int *status)
{
/*
    divide the integer pixel values in the input file by rescale,
    and write back out to the output file..
*/

	long ii, jj, nelem = 1, nx, ny;
	short *intarray, nullvalue;
	int anynul, tstatus, checknull = 1;
	
	nx = naxes[0];
	ny = 1;
	
	for (ii = 1; ii < naxis; ii++) {
	    ny = ny * naxes[ii];
	}

	intarray = calloc(nx, sizeof(short));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TSHORT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   checknull = 0;
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr,  1.0, 0.0, status);
	fits_set_bscale(outfptr, 1.0, 0.0, status);

	for (ii = 0; ii < ny; ii++) {

	    fits_read_img_sht(infptr, 1, nelem, nx,
	        0, intarray, &anynul, status);

	    if (checknull) {
	        for (jj = 0; jj < nx; jj++) {
	            if (intarray[jj] != nullvalue)
		        intarray[jj] = NSHRT( (intarray[jj] / rescale) );
		}
	    } else {
	        for (jj = 0; jj < nx; jj++)
		        intarray[jj] = NSHRT( (intarray[jj] / rescale) );
	    }

	    fits_write_img_sht(outfptr, 1, nelem, nx, intarray, status);
	      
	    nelem += nx;
	}

	free(intarray);
	return(*status);
}